

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::Reader::readObject(Reader *this,Token *tokenStart)

{
  TokenType TVar1;
  bool bVar2;
  _Elt_pointer ppVVar3;
  allocator local_f1;
  Value numberName;
  string name;
  Token comma;
  Token colon;
  Token tokenName;
  Value local_58;
  
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  Value::Value(&local_58,objectValue);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::swap(ppVVar3[-1],&local_58);
  Value::~Value(&local_58);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar3[-1]->start_ = (long)tokenStart->start_ - (long)this->begin_;
  do {
    readToken(this,&tokenName);
    while (TVar1 = tokenName.type_, tokenName.type_ == tokenComment) {
      readToken(this,&tokenName);
    }
    if ((tokenName.type_ == tokenObjectEnd) && (name._M_string_length == 0)) break;
    std::__cxx11::string::assign((char *)&name);
    if (TVar1 == tokenNumber) {
      if ((this->features_).allowNumericKeys_ == true) {
        numberName._8_2_ = numberName._8_2_ & 0xfe00;
        numberName.comments_ = (CommentInfo *)0x0;
        numberName.start_ = 0;
        numberName.limit_ = 0;
        bVar2 = decodeNumber(this,&tokenName,&numberName);
        if (bVar2) {
          Value::asString_abi_cxx11_((string *)&colon,&numberName);
          std::__cxx11::string::operator=((string *)&name,(string *)&colon);
          std::__cxx11::string::~string((string *)&colon);
        }
        else {
          recoverFromError(this,tokenObjectEnd);
        }
        Value::~Value(&numberName);
        if (bVar2) goto LAB_00107969;
        goto LAB_00107acc;
      }
LAB_00107a20:
      std::__cxx11::string::string
                ((string *)&numberName,"Missing \'}\' or object member name",(allocator *)&colon);
      addErrorAndRecover(this,(string *)&numberName,&tokenName,tokenObjectEnd);
LAB_00107ac2:
      std::__cxx11::string::~string((string *)&numberName);
LAB_00107acc:
      bVar2 = false;
      goto LAB_00107ace;
    }
    if (TVar1 != tokenString) goto LAB_00107a20;
    bVar2 = decodeString(this,&tokenName,&name);
    if (!bVar2) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_00107acc;
    }
LAB_00107969:
    readToken(this,&colon);
    if (colon.type_ != tokenMemberSeparator) {
      std::__cxx11::string::string
                ((string *)&numberName,"Missing \':\' after object member name",(allocator *)&comma)
      ;
      addErrorAndRecover(this,(string *)&numberName,&colon,tokenObjectEnd);
      goto LAB_00107ac2;
    }
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar3 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    numberName.value_.map_ = (ObjectValues *)Value::operator[](ppVVar3[-1],name._M_dataplus._M_p);
    std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
              ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&numberName);
    bVar2 = readValue(this);
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
    if (!bVar2) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_00107acc;
    }
    readToken(this,&comma);
    if ((tokenComment < comma.type_) || ((0x1404U >> (comma.type_ & 0x1f) & 1) == 0)) {
      std::__cxx11::string::string
                ((string *)&numberName,"Missing \',\' or \'}\' in object declaration",&local_f1);
      addErrorAndRecover(this,(string *)&numberName,&comma,tokenObjectEnd);
      goto LAB_00107ac2;
    }
    while (comma.type_ == tokenComment) {
      readToken(this,&comma);
    }
  } while (comma.type_ != tokenObjectEnd);
  bVar2 = true;
LAB_00107ace:
  std::__cxx11::string::~string((string *)&name);
  return bVar2;
}

Assistant:

bool Reader::readObject(Token& tokenStart) {
  Token tokenName;
  std::string name;
  currentValue() = Value(objectValue);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd && name.empty()) // empty object
      return true;
    name = "";
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover(
          "Missing ':' after object member name", colon, tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover(
          "Missing ',' or '}' in object declaration", comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover(
      "Missing '}' or object member name", tokenName, tokenObjectEnd);
}